

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_render_size(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  RK_U16 local_38 [2];
  RK_U16 local_34 [2];
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _value = current;
  current_local = (AV1RawFrameHeader *)gb;
  gb_local = &ctx->gb;
  value_1 = mpp_av1_read_unsigned(gb,1,"render_and_frame_size_different",&value_2,0,1);
  if ((int)value_1 < 0) {
    return value_1;
  }
  _value->render_and_frame_size_different = (RK_U8)value_2;
  if (_value->render_and_frame_size_different == '\0') {
    _value->render_width_minus_1 = _value->frame_width_minus_1;
    _value->render_height_minus_1 = _value->frame_height_minus_1;
  }
  else {
    value_1 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)current_local,0x10,"render_width_minus_1",
                         (RK_U32 *)local_34,0,0xffff);
    if ((int)value_1 < 0) {
      return value_1;
    }
    _value->render_width_minus_1 = local_34[0];
    RVar1 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)current_local,0x10,"render_height_minus_1",(RK_U32 *)local_38
                       ,0,0xffff);
    if (RVar1 < 0) {
      return RVar1;
    }
    _value->render_height_minus_1 = local_38[0];
  }
  gb_local[0x50].used_bits = _value->render_width_minus_1 + 1;
  *(uint *)&gb_local[0x50].field_0x34 = _value->render_height_minus_1 + 1;
  return 0;
}

Assistant:

static RK_S32 mpp_av1_render_size(AV1Context *ctx, BitReadCtx_t *gb,
                                  AV1RawFrameHeader *current)
{
    RK_S32 err;

    flag(render_and_frame_size_different);

    if (current->render_and_frame_size_different) {
        fb(16, render_width_minus_1);
        fb(16, render_height_minus_1);
    } else {
        infer(render_width_minus_1,  current->frame_width_minus_1);
        infer(render_height_minus_1, current->frame_height_minus_1);
    }

    ctx->render_width  = current->render_width_minus_1  + 1;
    ctx->render_height = current->render_height_minus_1 + 1;

    return 0;
}